

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O2

void * TPZStructMatrixOT<std::complex<double>_>::ThreadData::ThreadWork(void *datavoid)

{
  long lVar1;
  mutex_type *__m;
  long lVar2;
  long lVar3;
  int *piVar4;
  TPZCompMesh *mesh;
  TPZCompEl *pTVar5;
  bool bVar6;
  int iVar7;
  TPZCompEl **ppTVar8;
  long lVar9;
  long *plVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  TPZFMatrix<std::complex<double>_> *rhs;
  long lVar14;
  long lVar15;
  TPZAutoPointer<TPZGuiInterface> guiInterface;
  TPZFMatrix<std::complex<double>_> *pTStack_10420;
  unique_lock<std::mutex> lock;
  TPZElementMatrixT<std::complex<double>_> ek;
  TPZElementMatrixT<std::complex<double>_> ef;
  
  lVar2 = *(long *)((long)datavoid + 0x30);
  lVar3 = *(long *)((long)datavoid + 0x98);
  piVar4 = *(int **)((long)datavoid + 0x90);
  mesh = *(TPZCompMesh **)(*datavoid + 8);
  guiInterface.fRef = *(TPZReference **)((long)datavoid + 8);
  LOCK();
  ((guiInterface.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((guiInterface.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(&ek,mesh,EK);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(&ef,mesh,EF);
  plVar10 = *(long **)((long)datavoid + 0x20);
  lVar14 = *(long *)(*(long *)((long)datavoid + 0xa0) + 0x10);
  LOCK();
  lVar13 = *plVar10;
  *plVar10 = *plVar10 + 1;
  UNLOCK();
  lVar1 = lVar14 + -1;
  __m = (mutex_type *)((long)datavoid + 0x38);
  while (lVar13 < lVar14) {
    lVar11 = *(long *)(*(long *)(*(long *)((long)datavoid + 0xa0) + 8) + lVar13 * 8);
    if (lVar11 < 0) {
      std::operator<<((ostream *)&std::cout,"the element in ElColorSequence is negative???\n");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/pzstrmatrixot.cpp"
                 ,0x3a7);
    }
    ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar11);
    pTVar5 = *ppTVar8;
    (**(code **)(*(long *)pTVar5 + 0x110))(pTVar5,&ek,&ef);
    if (((guiInterface.fRef != (TPZReference *)0x0) &&
        ((guiInterface.fRef)->fPointer != (TPZGuiInterface *)0x0)) &&
       (bVar6 = TPZGuiInterface::AmIKilled((guiInterface.fRef)->fPointer), bVar6)) break;
    iVar7 = (**(code **)(*(long *)pTVar5 + 0x1f0))(pTVar5);
    if (iVar7 != 0) {
      TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(&ek);
      TPZElementMatrixT<std::complex<double>_>::ApplyConstraints(&ef);
    }
    TPZElementMatrix::ComputeDestinationIndices(&ek.super_TPZElementMatrix);
    TPZEquationFilter::Filter
              ((TPZEquationFilter *)(*datavoid + 0x48),
               &ek.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
               &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
    lVar11 = **(long **)((long)datavoid + 0xa8);
    lVar12 = lVar1;
    if (lVar1 < lVar11) {
      lVar12 = lVar11;
    }
    do {
      lVar9 = lVar11;
      lVar15 = lVar12;
      if (lVar1 <= lVar9) break;
      lVar11 = lVar9 + 1;
      lVar15 = lVar9;
    } while (*(long *)(*(long *)(lVar2 + 8) + 8 + lVar9 * 8) == 1);
    lVar11 = *(long *)(*(long *)(lVar3 + 8) + lVar13 * 8);
    while (lVar15 < lVar11) {
      std::unique_lock<std::mutex>::unique_lock(&lock,__m);
      *piVar4 = 1;
      std::condition_variable::wait((unique_lock *)((long)datavoid + 0x60));
      lVar15 = **(long **)((long)datavoid + 0xa8) + -1;
      do {
        lVar12 = lVar15 * 8;
        lVar15 = lVar15 + 1;
      } while (*(long *)(*(long *)(lVar2 + 8) + 0x10 + lVar12) == 1);
      std::unique_lock<std::mutex>::~unique_lock(&lock);
    }
    if (*(long *)((long)datavoid + 0x10) == 0) {
      plVar10 = (long *)0x0;
    }
    else {
      plVar10 = (long *)__dynamic_cast(*(long *)((long)datavoid + 0x10),&TPZBaseMatrix::typeinfo,
                                       &TPZMatrix<std::complex<double>>::typeinfo,0);
    }
    if (*(long *)((long)datavoid + 0x18) == 0) {
      pTStack_10420 = (TPZFMatrix<std::complex<double>_> *)0x0;
    }
    else {
      pTStack_10420 =
           (TPZFMatrix<std::complex<double>_> *)
           __dynamic_cast(*(long *)((long)datavoid + 0x18),&TPZBaseMatrix::typeinfo,
                          &TPZFMatrix<std::complex<double>>::typeinfo,0);
    }
    if (plVar10 != (long *)0x0) {
      bVar6 = TPZElementMatrix::HasDependency(&ek.super_TPZElementMatrix);
      if (bVar6) {
        (**(code **)(*plVar10 + 0x1a0))
                  (plVar10,&ek.fConstrMat,&ek.super_TPZElementMatrix.fSourceIndex,
                   &ek.super_TPZElementMatrix.fDestinationIndex);
        rhs = &ef.fConstrMat.super_TPZFMatrix<std::complex<double>_>;
        if (*(char *)((long)datavoid + 0xb0) == '\x01') {
LAB_011aa889:
          TPZFMatrix<std::complex<double>_>::AddFel
                    (pTStack_10420,rhs,&ek.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                     &ek.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
        }
      }
      else {
        (**(code **)(*plVar10 + 0x1a0))
                  (plVar10,&ek.fMat,&ek.super_TPZElementMatrix.fSourceIndex,
                   &ek.super_TPZElementMatrix.fDestinationIndex);
        rhs = &ef.fMat.super_TPZFMatrix<std::complex<double>_>;
        if (*(char *)((long)datavoid + 0xb0) != '\0') goto LAB_011aa889;
      }
    }
    lVar11 = lVar1;
    if (lVar1 < lVar15) {
      lVar11 = lVar15;
    }
    do {
      lVar12 = lVar11;
      if (lVar1 <= lVar15) break;
      lVar9 = lVar15 * 8;
      lVar12 = lVar15;
      lVar15 = lVar15 + 1;
    } while (*(long *)(*(long *)(lVar2 + 8) + 8 + lVar9) == 1);
    lVar12 = (ulong)(lVar12 == lVar13 + -1) + lVar12;
    lVar11 = lVar1;
    if (lVar1 < lVar12) {
      lVar11 = lVar12;
    }
    do {
      lVar15 = lVar11;
      if (lVar1 <= lVar12) break;
      lVar9 = lVar12 * 8;
      lVar15 = lVar12;
      lVar12 = lVar12 + 1;
    } while (*(long *)(*(long *)(lVar2 + 8) + 8 + lVar9) == 1);
    if (**(long **)((long)datavoid + 0xa8) < lVar15) {
      **(long **)((long)datavoid + 0xa8) = lVar15;
    }
    *(undefined8 *)(*(long *)(lVar2 + 8) + lVar13 * 8) = 1;
    if (*piVar4 != 0) {
      std::unique_lock<std::mutex>::unique_lock(&lock,__m);
      *piVar4 = 0;
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock(&lock);
    }
    plVar10 = *(long **)((long)datavoid + 0x20);
    LOCK();
    lVar13 = *plVar10;
    *plVar10 = *plVar10 + 1;
    UNLOCK();
  }
  std::unique_lock<std::mutex>::unique_lock(&lock,__m);
  lVar3 = **(long **)((long)datavoid + 0xa8);
  lVar14 = lVar3;
  lVar11 = lVar1;
  if (lVar1 < lVar3) {
    lVar11 = lVar3;
  }
  do {
    lVar12 = lVar11;
    if (lVar1 <= lVar14) break;
    lVar15 = lVar14 * 8;
    lVar12 = lVar14;
    lVar14 = lVar14 + 1;
  } while (*(long *)(*(long *)(lVar2 + 8) + 8 + lVar15) == 1);
  lVar12 = (ulong)(lVar12 == lVar13 + -1) + lVar12;
  if (lVar3 < lVar12) {
    **(long **)((long)datavoid + 0xa8) = lVar12;
  }
  std::condition_variable::notify_all();
  *piVar4 = 0;
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT(&ef);
  TPZElementMatrixT<std::complex<double>_>::~TPZElementMatrixT(&ek);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&guiInterface);
  return (void *)0x0;
}

Assistant:

void *TPZStructMatrixOT<TVar>::ThreadData::ThreadWork(void *datavoid)
{
    ThreadData *data = (ThreadData *) datavoid;
//    TPZStructMatrixOT *strmat = data->fStruct;
    TPZVec<int64_t> &ComputedElements = *(data->fComputedElements);
    TPZVec<int64_t> &ElBlocked = *(data->fElBlocked);

    int &SomeoneIsSleeping = *(data->fSomeoneIsSleeping);
    
    TPZCompMesh *cmesh = data->fStruct->Mesh();
    TPZAutoPointer<TPZGuiInterface> guiInterface = data->fGuiInterface;
    TPZElementMatrixT<TVar> ek(cmesh,TPZElementMatrix::EK);
    TPZElementMatrixT<TVar> ef(cmesh,TPZElementMatrix::EF);
    int64_t numelements = data->fElSequenceColor->size();
    int64_t index = data->fCurrentIndex->fetch_add(1);
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "ThreadData starting with " << data->fThreadSeqNum << " total elements " << numelements << std::endl;
        sout << "index = " << index << std::endl;
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    
#ifdef HUGEDEBUG
    data->fMutexAccessElement.lock();
    std::cout << "ThreadData starting with " << data->fThreadSeqNum << " total elements " << numelements << std::endl;
    std::cout << "index = " << index << std::endl;
    std::cout.flush();
    data->fMutexAccessElement.unlock();
#endif
    
    while (index < numelements)
    {
        
        int64_t iel = data->fElSequenceColor->operator[](index);
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << "Computing element " << index;
            LOGPZ_DEBUG(logger, sout.str())
        }
#endif
#ifdef PZ_LOG
        std::stringstream sout;
        sout << "Element " << index << " elapsed time ";
        TPZTimer timeforel(sout.str());
        timeforel.start();
#endif

        if (iel >= 0){
            TPZCompEl *el = cmesh->ElementVec()[iel];
#ifndef DRY_RUN
            el->CalcStiff(ek,ef);
#else
            TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(el);
            intel->InitializeElementMatrix(ek,ef);
#endif

            if(guiInterface) if(guiInterface->AmIKilled()){
                break;
            }
            
#ifndef DRY_RUN
            if(!el->HasDependency()) {
                
                ek.ComputeDestinationIndices();
                data->fStruct->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
                
#ifdef PZ_LOG
                if(loggerel.isDebugEnabled())
                {
                    std::stringstream sout;
                    ek.fMat.Print("Element stiffness matrix",sout);
                    ef.fMat.Print("Element right hand side", sout);
                    LOGPZ_DEBUG(loggerel,sout.str())
                }
#endif
            } else {
                // the element has dependent nodes
                ek.ApplyConstraints();
                ef.ApplyConstraints();
                ek.ComputeDestinationIndices();
                data->fStruct->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
            }
#endif
            
#ifdef PZ_LOG
            timeforel.stop();
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << timeforel.processName() <<  timeforel;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif

            int64_t localcompleted = *(data->fElementCompleted);
            bool localupdated = false;
            while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
                localcompleted++;
                localupdated = true;
            }
            int64_t needscomputed = ElBlocked[index];
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                if (localupdated) {
                    sout << "Localcompleted updated without thread lock\n";
                }
                
                sout << "Element " << index << " is computed and can assemble if required " << needscomputed << " is smaller than localcompleted " << localcompleted;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
            
#ifdef HUGEDEBUG
            data->fMutexAccessElement.lock();
            std::cout << "threadEK " << data->fThreadSeqNum << " index " << index << " localcompleted " << localcompleted << " needscomputed " << needscomputed << std::endl;
            data->fMutexAccessElement.unlock();
#endif
            
            bool hadtowait = false;
            while (needscomputed > localcompleted) {
                // block the thread till the element needed has been assembled
              std::unique_lock<std::mutex> lock(data->fMutexAccessElement);
                SomeoneIsSleeping = 1;
                hadtowait = true;
#ifdef HUGEDEBUG
                std::cout << "threadEK " <<data->fThreadSeqNum << " Index " << index << " going to sleep waiting for " << needscomputed << std::endl;
                std::cout.flush();
#endif
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Element " << index << " cannot be assembled - going to sleep";
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
                data->fConditionVar.wait(lock);
                
                localcompleted = *data->fElementCompleted;
                localupdated = false;
                while (ComputedElements[localcompleted+1] == 1) {
                    localcompleted++;
                    localupdated = true;
                }
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "thread wakeup for element index " << index << std::endl;
                    if (localupdated) {
                        sout << "Localcompleted updated without thread lock\n";
                    }
                    
                    sout << "Element " << index << " is computed and can assemble if required " << needscomputed << " is smaller than localcompleted " << localcompleted;
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
            }
            
#ifdef HUGEDEBUG
            if (hadtowait) {
              std::scoped_lock lock(data->fMutexAccessElement);
                std::cout << "threadEK " <<data->fThreadSeqNum << " Index " << index << " continuing\n";
            }
#endif
            
#ifndef DRY_RUN
            auto globMatrix =
                    dynamic_cast<TPZMatrix<TVar> *>(data->fGlobMatrix);
                auto globRhs =
                    dynamic_cast<TPZFMatrix<TVar> *>(data->fGlobRhs);
            if(globMatrix){
                // Assemble the matrix
                if(!ek.HasDependency())
                {
                    globMatrix->AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
                    if(data->fComputeRhs) globRhs->AddFel(ef.fMat,ek.fSourceIndex,ek.fDestinationIndex);
                }
                else
                {
                    globMatrix->AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
                    if(data->fComputeRhs)globRhs->AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
                }
                
            }
#endif
            
            localupdated = false;
            while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
                localcompleted++;
                localupdated = true;
            }
            if (localcompleted == index-1) {
                localcompleted++;
            }
            while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
                localcompleted++;
                localupdated = true;
            }
            bool elementcompletedupdate = false;
            if (*data->fElementCompleted < localcompleted) {
//                std::cout << "Updating element completed " << localcompleted << std::endl;
                *data->fElementCompleted = localcompleted;
                elementcompletedupdate = true;
            }
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Element " << index << " has been assembled ";
                if (localupdated) {
                    sout << "\nLocalcompleted updated without thread lock\n";
                }
                if (elementcompletedupdate) {
                    sout << "\nfElementCompleted updated to localcompleted\n";
                }
                sout << "local completed " << localcompleted;
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
            ComputedElements[index] = 1;
            if (SomeoneIsSleeping) {
              std::unique_lock<std::mutex> lock(data->fMutexAccessElement);
#ifdef HUGEDEBUG
                std::cout << "threadEK " <<data->fThreadSeqNum <<  " Computed index " << index << " Waking up ElementsCompleted " << *data->fElementCompleted << std::endl;
                std::cout.flush();
#endif
                
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    LOGPZ_DEBUG(logger, "condition broadcast")
                }
#endif
                SomeoneIsSleeping = 0;
                data->fConditionVar.notify_all();
            }

        }
        else
        {
            std::cout << "the element in ElColorSequence is negative???\n";
            DebugStop();
        }
        index = data->fCurrentIndex->fetch_add(1);
        
    }
    // just make sure threads that were accidentally blocked get woken up
    std::unique_lock<std::mutex> lock(data->fMutexAccessElement);
    bool localupdated = false;
    int64_t localcompleted = *(data->fElementCompleted);
    while (localcompleted < numelements-1 && ComputedElements[localcompleted+1] == 1) {
        localcompleted++;
        localupdated = true;
    }
    if (localcompleted == index-1) {
        localcompleted++;
    }
    bool elementcompletedupdate = false;
    if (*data->fElementCompleted < localcompleted) {
        //                std::cout << "Updating element completed " << localcompleted << std::endl;
        *data->fElementCompleted = localcompleted;
        elementcompletedupdate = true;
    }

#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        LOGPZ_DEBUG(logger, "Finishing up")
        if (localupdated) {
            LOGPZ_DEBUG(logger, "updated localcompleted")
        }
        if (elementcompletedupdate) {
            LOGPZ_DEBUG(logger, "updated fElementCompleted")
        }
        if (localupdated || elementcompletedupdate) {
            std::stringstream sout;
            sout << "localcompleted " << localcompleted;
            LOGPZ_DEBUG(logger, sout.str())
        }
        LOGPZ_DEBUG(logger, "finishing and condition broadcast")
    }
#endif
    data->fConditionVar.notify_all();
    SomeoneIsSleeping = 0;
    return 0;
}